

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int get_first_ssl_listener_index(mg_context *ctx)

{
  bool bVar1;
  uint local_20;
  uint local_18;
  uint local_14;
  int idx;
  uint i;
  mg_context *ctx_local;
  
  local_18 = 0xffffffff;
  if (ctx != (mg_context *)0x0) {
    local_14 = 0;
    while( true ) {
      bVar1 = false;
      if (local_18 == 0xffffffff) {
        bVar1 = local_14 < ctx->num_listening_sockets;
      }
      if (!bVar1) break;
      if (ctx->listening_sockets[local_14].is_ssl == '\0') {
        local_20 = 0xffffffff;
      }
      else {
        local_20 = local_14;
      }
      local_18 = local_20;
      local_14 = local_14 + 1;
    }
  }
  return local_18;
}

Assistant:

static int
get_first_ssl_listener_index(const struct mg_context *ctx)
{
	unsigned int i;
	int idx = -1;
	if (ctx) {
		for (i = 0; ((idx == -1) && (i < ctx->num_listening_sockets)); i++) {
			idx = ctx->listening_sockets[i].is_ssl ? ((int)(i)) : -1;
		}
	}
	return idx;
}